

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

void address_space_stl_notdirty_riscv64
               (uc_struct_conflict13 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion_conflict *mr;
  uint32_t *puVar2;
  hwaddr addr1;
  hwaddr l;
  
  l = 4;
  mr = address_space_translate(as,addr,&addr1,&l,true,attrs);
  if (((l < 4) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_riscv64(uc,mr,addr1,(ulong)val,MO_32,attrs);
  }
  else {
    puVar2 = (uint32_t *)
             qemu_map_ram_ptr_riscv64((uc_struct_conflict13 *)mr->uc,mr->ram_block,addr1);
    *puVar2 = val;
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

void glue(address_space_stl_notdirty, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 4;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 4 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);

        r = memory_region_dispatch_write(uc, mr, addr1, val, MO_32, attrs);
    } else {
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        stl_p(ptr, val);

        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}